

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bit_field.cpp
# Opt level: O3

void __thiscall
BitField_Subtraction_Test::~BitField_Subtraction_Test(BitField_Subtraction_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (BitField, Subtraction) {
    union {
        std::uint8_t v;
        pstore::bit_field<std::uint8_t, 0, 2> f1;
    };
    v = 0U;
    f1 = std::uint8_t{3};
    pstore::bit_field<std::uint8_t, 0, 2> const r1 = --f1;
    EXPECT_EQ (f1, 2U);
    EXPECT_EQ (r1, 2U);
    pstore::bit_field<std::uint8_t, 0, 2> const r2 = f1--;
    EXPECT_EQ (f1, 1U);
    EXPECT_EQ (r2, 2U);
    f1 = std::uint8_t{3};
    f1.operator-=(std::uint8_t{2});
    EXPECT_EQ (f1, 1U);
    EXPECT_EQ (v, 1U);
}